

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O0

XXH64_hash_t XXH3_hashLong_64b(void *data,size_t len,XXH64_hash_t seed)

{
  int iVar1;
  XXH64_hash_t XVar2;
  undefined8 in_RDX;
  U32 key [48];
  U64 acc [8];
  int i;
  U32 seed2;
  U32 seed1;
  int aiStackY_1c0 [8];
  size_t in_stack_fffffffffffffe60;
  void *in_stack_fffffffffffffe68;
  U64 *in_stack_fffffffffffffe70;
  U64 in_stack_fffffffffffffea8;
  U32 *in_stack_fffffffffffffeb0;
  U64 *in_stack_fffffffffffffeb8;
  int local_6c;
  
  iVar1 = (int)((ulong)in_RDX >> 0x20);
  for (local_6c = 0; local_6c < 0x30; local_6c = local_6c + 4) {
    aiStackY_1c0[local_6c] = kKey[local_6c] + (int)in_RDX;
    aiStackY_1c0[local_6c + 1] = kKey[local_6c + 1] - iVar1;
    aiStackY_1c0[local_6c + 2] = kKey[local_6c + 2] + iVar1;
    aiStackY_1c0[local_6c + 3] = kKey[local_6c + 3] - (int)in_RDX;
  }
  XXH3_hashLong(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  XVar2 = XXH3_mergeAccs(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                         in_stack_fffffffffffffea8);
  return XVar2;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t    /* It's important for performance that XXH3_hashLong is not inlined. Not sure why (uop cache maybe ?), but difference is large and easily measurable */
XXH3_hashLong_64b(const void* data, size_t len, XXH64_hash_t seed)
{
    ALIGN(64) U64 acc[ACC_NB] = { seed, PRIME64_1, PRIME64_2, PRIME64_3, PRIME64_4, PRIME64_5, (U64)0 - seed, 0 };
    ALIGN(64) U32 key[KEYSET_DEFAULT_SIZE];

    XXH3_initKeySeed(key, seed);

    XXH3_hashLong(acc, data, len);

    /* converge into final hash */
    assert(sizeof(acc) == 64);
    return XXH3_mergeAccs(acc, key, (U64)len * PRIME64_1);
}